

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_table_filter.cpp
# Opt level: O2

unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true> __thiscall
duckdb::ConjunctionOrFilter::Deserialize(ConjunctionOrFilter *this,Deserializer *deserializer)

{
  tuple<duckdb::ConjunctionOrFilter_*,_std::default_delete<duckdb::ConjunctionOrFilter>_> this_00;
  pointer pCVar1;
  __uniq_ptr_impl<duckdb::ConjunctionOrFilter,_std::default_delete<duckdb::ConjunctionOrFilter>_>
  local_20;
  
  this_00.
  super__Tuple_impl<0UL,_duckdb::ConjunctionOrFilter_*,_std::default_delete<duckdb::ConjunctionOrFilter>_>
  .super__Head_base<0UL,_duckdb::ConjunctionOrFilter_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_duckdb::ConjunctionOrFilter_*,_std::default_delete<duckdb::ConjunctionOrFilter>_>
        )operator_new(0x28);
  ConjunctionOrFilter((ConjunctionOrFilter *)
                      this_00.
                      super__Tuple_impl<0UL,_duckdb::ConjunctionOrFilter_*,_std::default_delete<duckdb::ConjunctionOrFilter>_>
                      .super__Head_base<0UL,_duckdb::ConjunctionOrFilter_*,_false>._M_head_impl);
  local_20._M_t.
  super__Tuple_impl<0UL,_duckdb::ConjunctionOrFilter_*,_std::default_delete<duckdb::ConjunctionOrFilter>_>
  .super__Head_base<0UL,_duckdb::ConjunctionOrFilter_*,_false>._M_head_impl =
       (tuple<duckdb::ConjunctionOrFilter_*,_std::default_delete<duckdb::ConjunctionOrFilter>_>)
       (tuple<duckdb::ConjunctionOrFilter_*,_std::default_delete<duckdb::ConjunctionOrFilter>_>)
       this_00.
       super__Tuple_impl<0UL,_duckdb::ConjunctionOrFilter_*,_std::default_delete<duckdb::ConjunctionOrFilter>_>
       .super__Head_base<0UL,_duckdb::ConjunctionOrFilter_*,_false>._M_head_impl;
  pCVar1 = unique_ptr<duckdb::ConjunctionOrFilter,_std::default_delete<duckdb::ConjunctionOrFilter>,_true>
           ::operator->((unique_ptr<duckdb::ConjunctionOrFilter,_std::default_delete<duckdb::ConjunctionOrFilter>,_true>
                         *)&local_20);
  Deserializer::
  ReadPropertyWithDefault<duckdb::vector<duckdb::unique_ptr<duckdb::TableFilter,std::default_delete<duckdb::TableFilter>,true>,true>>
            (deserializer,200,"child_filters",&(pCVar1->super_ConjunctionFilter).child_filters);
  (this->super_ConjunctionFilter).super_TableFilter._vptr_TableFilter =
       (_func_int **)
       local_20._M_t.
       super__Tuple_impl<0UL,_duckdb::ConjunctionOrFilter_*,_std::default_delete<duckdb::ConjunctionOrFilter>_>
       .super__Head_base<0UL,_duckdb::ConjunctionOrFilter_*,_false>._M_head_impl;
  return (unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>_>)
         (unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>_>)this;
}

Assistant:

unique_ptr<TableFilter> ConjunctionOrFilter::Deserialize(Deserializer &deserializer) {
	auto result = duckdb::unique_ptr<ConjunctionOrFilter>(new ConjunctionOrFilter());
	deserializer.ReadPropertyWithDefault<vector<unique_ptr<TableFilter>>>(200, "child_filters", result->child_filters);
	return std::move(result);
}